

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_select(roaring_bitmap_t *bm,uint32_t rank,uint32_t *element)

{
  _Bool _Var1;
  uint in_EAX;
  run_container_t *container;
  uint uVar2;
  long lVar3;
  uint32_t start_rank;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  lVar3 = 0;
  _Var1 = false;
  while( true ) {
    if (_Var1 != false) {
      *element = *element | (uint)(bm->high_low_container).keys[lVar3 + -1] << 0x10;
      return _Var1;
    }
    if ((bm->high_low_container).size <= lVar3) break;
    uStack_38._0_4_ = CONCAT13((bm->high_low_container).typecodes[lVar3],(undefined3)uStack_38);
    container = (run_container_t *)
                container_unwrap_shared
                          ((bm->high_low_container).containers[lVar3],
                           (uint8_t *)((long)&uStack_38 + 3));
    if (uStack_38._3_1_ == '\x03') {
      _Var1 = run_container_select(container,(uint32_t *)((long)&uStack_38 + 4),rank,element);
    }
    else if (uStack_38._3_1_ == '\x02') {
      uVar2 = container->n_runs + uStack_38._4_4_;
      if (rank < uVar2) {
        *element = (uint)(&container->runs->value)[rank - uStack_38._4_4_];
        _Var1 = true;
      }
      else {
        uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
        _Var1 = false;
      }
    }
    else {
      if (uStack_38._3_1_ != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x18b0,
                      "_Bool container_select(const container_t *, uint8_t, uint32_t *, uint32_t, uint32_t *)"
                     );
      }
      _Var1 = bitset_container_select
                        ((bitset_container_t *)container,(uint32_t *)((long)&uStack_38 + 4),rank,
                         element);
    }
    lVar3 = lVar3 + 1;
  }
  return false;
}

Assistant:

bool roaring_bitmap_select(const roaring_bitmap_t *bm, uint32_t rank,
                           uint32_t *element) {
    container_t *container;
    uint8_t typecode;
    uint16_t key;
    uint32_t start_rank = 0;
    int i = 0;
    bool valid = false;
    while (!valid && i < bm->high_low_container.size) {
        container = bm->high_low_container.containers[i];
        typecode = bm->high_low_container.typecodes[i];
        valid =
            container_select(container, typecode, &start_rank, rank, element);
        i++;
    }

    if (valid) {
        key = bm->high_low_container.keys[i - 1];
        *element |= (((uint32_t)key) << 16);  // w/o cast, key promotes signed
        return true;
    } else
        return false;
}